

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::SubGridIntersector1Moeller<8,_true>_>::pointQuery
               (Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  ulong *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar12;
  Geometry *this;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  ulong uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  byte bVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar42;
  byte bVar43;
  bool bVar44;
  long lVar45;
  byte bVar46;
  long lVar47;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar48;
  size_t sVar49;
  bool bVar50;
  ulong uVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  undefined1 auVar66 [16];
  float fVar72;
  float fVar73;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar67 [32];
  float fVar74;
  float fVar78;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar86;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar93 [64];
  long lStack_2500;
  undefined1 local_24e8 [16];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_24e8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    local_24e8 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  }
  pSVar48 = stack + 1;
  fVar2 = (query->p).field_0.field_0.x;
  auVar91._4_4_ = fVar2;
  auVar91._0_4_ = fVar2;
  auVar91._8_4_ = fVar2;
  auVar91._12_4_ = fVar2;
  auVar91._16_4_ = fVar2;
  auVar91._20_4_ = fVar2;
  auVar91._24_4_ = fVar2;
  auVar91._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.y;
  auVar90._4_4_ = fVar3;
  auVar90._0_4_ = fVar3;
  auVar90._8_4_ = fVar3;
  auVar90._12_4_ = fVar3;
  auVar90._16_4_ = fVar3;
  auVar90._20_4_ = fVar3;
  auVar90._24_4_ = fVar3;
  auVar90._28_4_ = fVar3;
  fVar4 = (query->p).field_0.field_0.z;
  auVar88._4_4_ = fVar4;
  auVar88._0_4_ = fVar4;
  auVar88._8_4_ = fVar4;
  auVar88._12_4_ = fVar4;
  auVar88._16_4_ = fVar4;
  auVar88._20_4_ = fVar4;
  auVar88._24_4_ = fVar4;
  auVar88._28_4_ = fVar4;
  uVar5 = *(undefined4 *)&(context->query_radius).field_0;
  auVar59._4_4_ = uVar5;
  auVar59._0_4_ = uVar5;
  auVar59._8_4_ = uVar5;
  auVar59._12_4_ = uVar5;
  auVar59._16_4_ = uVar5;
  auVar59._20_4_ = uVar5;
  auVar59._24_4_ = uVar5;
  auVar59._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar67._4_4_ = uVar5;
  auVar67._0_4_ = uVar5;
  auVar67._8_4_ = uVar5;
  auVar67._12_4_ = uVar5;
  auVar67._16_4_ = uVar5;
  auVar67._20_4_ = uVar5;
  auVar67._24_4_ = uVar5;
  auVar67._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar80._4_4_ = uVar5;
  auVar80._0_4_ = uVar5;
  auVar80._8_4_ = uVar5;
  auVar80._12_4_ = uVar5;
  auVar80._16_4_ = uVar5;
  auVar80._20_4_ = uVar5;
  auVar80._24_4_ = uVar5;
  auVar80._28_4_ = uVar5;
  bVar44 = false;
  auVar92 = ZEXT3264(_DAT_01fb4ba0);
  auVar89 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar25 = vsubps_avx(auVar91,auVar59);
    fVar18 = auVar59._0_4_;
    fVar19 = auVar59._4_4_;
    fVar20 = auVar59._8_4_;
    fVar21 = auVar59._12_4_;
    fVar22 = auVar59._16_4_;
    fVar23 = auVar59._20_4_;
    fVar24 = auVar59._24_4_;
    fVar86 = fVar2 + auVar59._28_4_;
    auVar59 = vsubps_avx(auVar90,auVar67);
    fVar65 = fVar3 + auVar67._0_4_;
    fVar72 = fVar3 + auVar67._4_4_;
    fVar73 = fVar3 + auVar67._8_4_;
    fVar74 = fVar3 + auVar67._12_4_;
    fVar75 = fVar3 + auVar67._16_4_;
    fVar76 = fVar3 + auVar67._20_4_;
    fVar77 = fVar3 + auVar67._24_4_;
    fVar78 = fVar3 + auVar67._28_4_;
    auVar67 = vsubps_avx(auVar88,auVar80);
    auVar68._0_4_ = fVar4 + auVar80._0_4_;
    auVar68._4_4_ = fVar4 + auVar80._4_4_;
    auVar68._8_4_ = fVar4 + auVar80._8_4_;
    auVar68._12_4_ = fVar4 + auVar80._12_4_;
    auVar68._16_4_ = fVar4 + auVar80._16_4_;
    auVar68._20_4_ = fVar4 + auVar80._20_4_;
    auVar68._24_4_ = fVar4 + auVar80._24_4_;
    auVar68._28_4_ = fVar4 + auVar80._28_4_;
    auVar93._0_4_ = fVar18 * fVar18;
    auVar93._4_4_ = fVar19 * fVar19;
    auVar93._8_4_ = fVar20 * fVar20;
    auVar93._12_4_ = fVar21 * fVar21;
    auVar93._16_4_ = fVar22 * fVar22;
    auVar93._20_4_ = fVar23 * fVar23;
    auVar93._28_36_ = in_ZMM11._28_36_;
    auVar93._24_4_ = fVar24 * fVar24;
    auVar80 = auVar93._0_32_;
LAB_01c82260:
    do {
      if (pSVar48 == stack) {
        return bVar44;
      }
      pSVar42 = pSVar48 + -1;
      pSVar48 = pSVar48 + -1;
    } while ((float)local_24e8._0_4_ < (float)pSVar42->dist);
    sVar49 = (pSVar48->ptr).ptr;
LAB_01c8227d:
    while (context->query_type != POINT_QUERY_TYPE_SPHERE) {
      if ((sVar49 & 8) != 0) goto LAB_01c826f8;
      auVar54 = *(undefined1 (*) [32])(sVar49 + 0x40);
      auVar26 = *(undefined1 (*) [32])(sVar49 + 0x60);
      auVar52 = vmaxps_avx(auVar91,auVar54);
      auVar52 = vminps_avx(auVar52,auVar26);
      auVar53 = vsubps_avx(auVar52,auVar91);
      auVar52 = vmaxps_avx(auVar90,*(undefined1 (*) [32])(sVar49 + 0x80));
      auVar52 = vminps_avx(auVar52,*(undefined1 (*) [32])(sVar49 + 0xa0));
      auVar55 = vsubps_avx(auVar52,auVar90);
      auVar52 = vmaxps_avx(auVar88,*(undefined1 (*) [32])(sVar49 + 0xc0));
      auVar52 = vminps_avx(auVar52,*(undefined1 (*) [32])(sVar49 + 0xe0));
      auVar52 = vsubps_avx(auVar52,auVar88);
      auVar60._0_4_ =
           auVar53._0_4_ * auVar53._0_4_ + auVar55._0_4_ * auVar55._0_4_ +
           auVar52._0_4_ * auVar52._0_4_;
      auVar60._4_4_ =
           auVar53._4_4_ * auVar53._4_4_ + auVar55._4_4_ * auVar55._4_4_ +
           auVar52._4_4_ * auVar52._4_4_;
      auVar60._8_4_ =
           auVar53._8_4_ * auVar53._8_4_ + auVar55._8_4_ * auVar55._8_4_ +
           auVar52._8_4_ * auVar52._8_4_;
      auVar60._12_4_ =
           auVar53._12_4_ * auVar53._12_4_ + auVar55._12_4_ * auVar55._12_4_ +
           auVar52._12_4_ * auVar52._12_4_;
      auVar60._16_4_ =
           auVar53._16_4_ * auVar53._16_4_ + auVar55._16_4_ * auVar55._16_4_ +
           auVar52._16_4_ * auVar52._16_4_;
      auVar60._20_4_ =
           auVar53._20_4_ * auVar53._20_4_ + auVar55._20_4_ * auVar55._20_4_ +
           auVar52._20_4_ * auVar52._20_4_;
      auVar60._24_4_ =
           auVar53._24_4_ * auVar53._24_4_ + auVar55._24_4_ * auVar55._24_4_ +
           auVar52._24_4_ * auVar52._24_4_;
      auVar60._28_4_ = auVar53._28_4_ + auVar55._28_4_ + auVar55._28_4_;
      auVar89 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      uVar35 = vcmpps_avx512vl(auVar54,auVar26,2);
      uVar28 = vcmpps_avx512vl(auVar26,auVar25,1);
      auVar26._4_4_ = fVar2 + fVar19;
      auVar26._0_4_ = fVar2 + fVar18;
      auVar26._8_4_ = fVar2 + fVar20;
      auVar26._12_4_ = fVar2 + fVar21;
      auVar26._16_4_ = fVar2 + fVar22;
      auVar26._20_4_ = fVar2 + fVar23;
      auVar26._24_4_ = fVar2 + fVar24;
      auVar26._28_4_ = fVar86;
      uVar33 = vcmpps_avx512vl(auVar54,auVar26,6);
      uVar29 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar49 + 0xa0),auVar59,1);
      auVar54._4_4_ = fVar72;
      auVar54._0_4_ = fVar65;
      auVar54._8_4_ = fVar73;
      auVar54._12_4_ = fVar74;
      auVar54._16_4_ = fVar75;
      auVar54._20_4_ = fVar76;
      auVar54._24_4_ = fVar77;
      auVar54._28_4_ = fVar78;
      uVar30 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar49 + 0x80),auVar54,6);
      uVar31 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar49 + 0xe0),auVar67,1);
      uVar32 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar49 + 0xc0),auVar68,6);
      uVar51 = (ulong)(byte)(~((byte)uVar30 | (byte)uVar33 | (byte)uVar32 | (byte)uVar28 |
                              (byte)uVar29 | (byte)uVar31) & (byte)uVar35);
LAB_01c822ff:
      bVar46 = (byte)uVar51;
      if (bVar46 == 0) goto LAB_01c82260;
      auVar54 = *(undefined1 (*) [32])(sVar49 & 0xfffffffffffffff0);
      auVar26 = ((undefined1 (*) [32])(sVar49 & 0xfffffffffffffff0))[1];
      auVar52 = vpternlogd_avx512vl(auVar92._0_32_,auVar60,auVar89._0_32_,0xf8);
      auVar53 = vpcompressd_avx512vl(auVar52);
      auVar55._0_4_ = (uint)(bVar46 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar46 & 1) * auVar52._0_4_
      ;
      bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar50 * auVar53._4_4_ | (uint)!bVar50 * auVar52._4_4_;
      bVar50 = (bool)((byte)(uVar51 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar50 * auVar53._8_4_ | (uint)!bVar50 * auVar52._8_4_;
      bVar50 = (bool)((byte)(uVar51 >> 3) & 1);
      auVar55._12_4_ = (uint)bVar50 * auVar53._12_4_ | (uint)!bVar50 * auVar52._12_4_;
      bVar50 = (bool)((byte)(uVar51 >> 4) & 1);
      auVar55._16_4_ = (uint)bVar50 * auVar53._16_4_ | (uint)!bVar50 * auVar52._16_4_;
      bVar50 = (bool)((byte)(uVar51 >> 5) & 1);
      auVar55._20_4_ = (uint)bVar50 * auVar53._20_4_ | (uint)!bVar50 * auVar52._20_4_;
      bVar50 = (bool)((byte)(uVar51 >> 6) & 1);
      auVar55._24_4_ = (uint)bVar50 * auVar53._24_4_ | (uint)!bVar50 * auVar52._24_4_;
      bVar50 = SUB81(uVar51 >> 7,0);
      auVar55._28_4_ = (uint)bVar50 * auVar53._28_4_ | (uint)!bVar50 * auVar52._28_4_;
      auVar52 = vpermt2q_avx512vl(auVar54,auVar55,auVar26);
      sVar49 = auVar52._0_8_;
      bVar46 = bVar46 - 1 & bVar46;
      if (bVar46 != 0) goto LAB_01c8245b;
    }
    if ((sVar49 & 8) == 0) {
      auVar54 = vmaxps_avx(auVar91,*(undefined1 (*) [32])(sVar49 + 0x40));
      auVar54 = vminps_avx(auVar54,*(undefined1 (*) [32])(sVar49 + 0x60));
      auVar26 = vsubps_avx(auVar54,auVar91);
      auVar54 = vmaxps_avx(auVar90,*(undefined1 (*) [32])(sVar49 + 0x80));
      auVar54 = vminps_avx(auVar54,*(undefined1 (*) [32])(sVar49 + 0xa0));
      auVar52 = vsubps_avx(auVar54,auVar90);
      auVar54 = vmaxps_avx(auVar88,*(undefined1 (*) [32])(sVar49 + 0xc0));
      auVar54 = vminps_avx(auVar54,*(undefined1 (*) [32])(sVar49 + 0xe0));
      auVar54 = vsubps_avx(auVar54,auVar88);
      auVar60._0_4_ =
           auVar26._0_4_ * auVar26._0_4_ + auVar52._0_4_ * auVar52._0_4_ +
           auVar54._0_4_ * auVar54._0_4_;
      auVar60._4_4_ =
           auVar26._4_4_ * auVar26._4_4_ + auVar52._4_4_ * auVar52._4_4_ +
           auVar54._4_4_ * auVar54._4_4_;
      auVar60._8_4_ =
           auVar26._8_4_ * auVar26._8_4_ + auVar52._8_4_ * auVar52._8_4_ +
           auVar54._8_4_ * auVar54._8_4_;
      auVar60._12_4_ =
           auVar26._12_4_ * auVar26._12_4_ + auVar52._12_4_ * auVar52._12_4_ +
           auVar54._12_4_ * auVar54._12_4_;
      auVar60._16_4_ =
           auVar26._16_4_ * auVar26._16_4_ + auVar52._16_4_ * auVar52._16_4_ +
           auVar54._16_4_ * auVar54._16_4_;
      auVar60._20_4_ =
           auVar26._20_4_ * auVar26._20_4_ + auVar52._20_4_ * auVar52._20_4_ +
           auVar54._20_4_ * auVar54._20_4_;
      auVar60._24_4_ =
           auVar26._24_4_ * auVar26._24_4_ + auVar52._24_4_ * auVar52._24_4_ +
           auVar54._24_4_ * auVar54._24_4_;
      auVar60._28_4_ = auVar26._28_4_ + auVar52._28_4_ + auVar52._28_4_;
      uVar51 = vcmpps_avx512vl(auVar60,auVar80,2);
      uVar27 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar49 + 0x40),
                               *(undefined1 (*) [32])(sVar49 + 0x60),2);
      uVar51 = uVar51 & uVar27;
      goto LAB_01c822ff;
    }
LAB_01c826f8:
    bVar46 = 0;
    for (lVar45 = 0; in_ZMM11 = ZEXT3264(auVar80), lVar45 != (ulong)((uint)sVar49 & 0xf) - 8;
        lVar45 = lVar45 + 1) {
      puVar1 = (ulong *)((sVar49 & 0xfffffffffffffff0) + 0x40 + lVar45 * 0x90);
      if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
        uVar5 = (undefined4)puVar1[6];
        auVar61._4_4_ = uVar5;
        auVar61._0_4_ = uVar5;
        auVar61._8_4_ = uVar5;
        auVar61._12_4_ = uVar5;
        auVar61._16_4_ = uVar5;
        auVar61._20_4_ = uVar5;
        auVar61._24_4_ = uVar5;
        auVar61._28_4_ = uVar5;
        uVar5 = *(undefined4 *)((long)puVar1 + 0x3c);
        auVar69._4_4_ = uVar5;
        auVar69._0_4_ = uVar5;
        auVar69._8_4_ = uVar5;
        auVar69._12_4_ = uVar5;
        auVar69._16_4_ = uVar5;
        auVar69._20_4_ = uVar5;
        auVar69._24_4_ = uVar5;
        auVar69._28_4_ = uVar5;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *puVar1;
        auVar54 = vpmovzxbd_avx2(auVar79);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar38 = vfmadd213ps_fma(auVar54,auVar69,auVar61);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = puVar1[1];
        auVar54 = vpmovzxbd_avx2(auVar87);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar39 = vfmadd213ps_fma(auVar54,auVar69,auVar61);
        uVar5 = *(undefined4 *)((long)puVar1 + 0x34);
        auVar62._4_4_ = uVar5;
        auVar62._0_4_ = uVar5;
        auVar62._8_4_ = uVar5;
        auVar62._12_4_ = uVar5;
        auVar62._16_4_ = uVar5;
        auVar62._20_4_ = uVar5;
        auVar62._24_4_ = uVar5;
        auVar62._28_4_ = uVar5;
        uVar5 = (undefined4)puVar1[8];
        auVar70._4_4_ = uVar5;
        auVar70._0_4_ = uVar5;
        auVar70._8_4_ = uVar5;
        auVar70._12_4_ = uVar5;
        auVar70._16_4_ = uVar5;
        auVar70._20_4_ = uVar5;
        auVar70._24_4_ = uVar5;
        auVar70._28_4_ = uVar5;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = puVar1[2];
        auVar54 = vpmovzxbd_avx2(auVar7);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar40 = vfmadd213ps_fma(auVar54,auVar70,auVar62);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = puVar1[3];
        auVar54 = vpmovzxbd_avx2(auVar8);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar41 = vfmadd213ps_fma(auVar54,auVar70,auVar62);
        uVar5 = (undefined4)puVar1[7];
        auVar63._4_4_ = uVar5;
        auVar63._0_4_ = uVar5;
        auVar63._8_4_ = uVar5;
        auVar63._12_4_ = uVar5;
        auVar63._16_4_ = uVar5;
        auVar63._20_4_ = uVar5;
        auVar63._24_4_ = uVar5;
        auVar63._28_4_ = uVar5;
        uVar5 = *(undefined4 *)((long)puVar1 + 0x44);
        auVar71._4_4_ = uVar5;
        auVar71._0_4_ = uVar5;
        auVar71._8_4_ = uVar5;
        auVar71._12_4_ = uVar5;
        auVar71._16_4_ = uVar5;
        auVar71._20_4_ = uVar5;
        auVar71._24_4_ = uVar5;
        auVar71._28_4_ = uVar5;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = puVar1[4];
        auVar54 = vpmovzxbd_avx2(auVar9);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar58 = vfmadd213ps_fma(auVar54,auVar71,auVar63);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = puVar1[5];
        auVar54 = vpmovzxbd_avx2(auVar10);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar66 = vfmadd213ps_fma(auVar54,auVar71,auVar63);
        auVar54 = vmaxps_avx(auVar91,ZEXT1632(auVar38));
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar39));
        auVar26 = vsubps_avx(auVar54,auVar91);
        auVar54 = vmaxps_avx(auVar90,ZEXT1632(auVar40));
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar41));
        auVar52 = vsubps_avx(auVar54,auVar90);
        auVar54 = vmaxps_avx(auVar88,ZEXT1632(auVar58));
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar66));
        auVar54 = vsubps_avx(auVar54,auVar88);
        auVar64._0_4_ =
             auVar26._0_4_ * auVar26._0_4_ + auVar52._0_4_ * auVar52._0_4_ +
             auVar54._0_4_ * auVar54._0_4_;
        auVar64._4_4_ =
             auVar26._4_4_ * auVar26._4_4_ + auVar52._4_4_ * auVar52._4_4_ +
             auVar54._4_4_ * auVar54._4_4_;
        auVar64._8_4_ =
             auVar26._8_4_ * auVar26._8_4_ + auVar52._8_4_ * auVar52._8_4_ +
             auVar54._8_4_ * auVar54._8_4_;
        auVar64._12_4_ =
             auVar26._12_4_ * auVar26._12_4_ + auVar52._12_4_ * auVar52._12_4_ +
             auVar54._12_4_ * auVar54._12_4_;
        auVar64._16_4_ =
             auVar26._16_4_ * auVar26._16_4_ + auVar52._16_4_ * auVar52._16_4_ +
             auVar54._16_4_ * auVar54._16_4_;
        auVar64._20_4_ =
             auVar26._20_4_ * auVar26._20_4_ + auVar52._20_4_ * auVar52._20_4_ +
             auVar54._20_4_ * auVar54._20_4_;
        auVar64._24_4_ =
             auVar26._24_4_ * auVar26._24_4_ + auVar52._24_4_ * auVar52._24_4_ +
             auVar54._24_4_ * auVar54._24_4_;
        auVar64._28_4_ = auVar26._28_4_ + auVar52._28_4_ + auVar52._28_4_;
        uVar35 = vcmpps_avx512vl(ZEXT1632(auVar38),ZEXT1632(auVar39),2);
        uVar33 = vpcmpub_avx512vl(auVar79,auVar87,2);
        uVar28 = vcmpps_avx512vl(auVar64,auVar80,2);
        bVar43 = (byte)uVar35 & (byte)uVar28 & (byte)uVar33;
      }
      else {
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *puVar1;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = puVar1[1];
        uVar34 = vpcmpub_avx512vl(auVar58,auVar66,2);
        uVar5 = (undefined4)puVar1[6];
        auVar81._4_4_ = uVar5;
        auVar81._0_4_ = uVar5;
        auVar81._8_4_ = uVar5;
        auVar81._12_4_ = uVar5;
        auVar81._16_4_ = uVar5;
        auVar81._20_4_ = uVar5;
        auVar81._24_4_ = uVar5;
        auVar81._28_4_ = uVar5;
        uVar5 = *(undefined4 *)((long)puVar1 + 0x3c);
        auVar83._4_4_ = uVar5;
        auVar83._0_4_ = uVar5;
        auVar83._8_4_ = uVar5;
        auVar83._12_4_ = uVar5;
        auVar83._16_4_ = uVar5;
        auVar83._20_4_ = uVar5;
        auVar83._24_4_ = uVar5;
        auVar83._28_4_ = uVar5;
        auVar54 = vpmovzxbd_avx2(auVar58);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar58 = vfmadd213ps_fma(auVar54,auVar83,auVar81);
        auVar54 = vpmovzxbd_avx2(auVar66);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar66 = vfmadd213ps_fma(auVar54,auVar83,auVar81);
        uVar5 = *(undefined4 *)((long)puVar1 + 0x34);
        auVar82._4_4_ = uVar5;
        auVar82._0_4_ = uVar5;
        auVar82._8_4_ = uVar5;
        auVar82._12_4_ = uVar5;
        auVar82._16_4_ = uVar5;
        auVar82._20_4_ = uVar5;
        auVar82._24_4_ = uVar5;
        auVar82._28_4_ = uVar5;
        uVar5 = (undefined4)puVar1[8];
        auVar84._4_4_ = uVar5;
        auVar84._0_4_ = uVar5;
        auVar84._8_4_ = uVar5;
        auVar84._12_4_ = uVar5;
        auVar84._16_4_ = uVar5;
        auVar84._20_4_ = uVar5;
        auVar84._24_4_ = uVar5;
        auVar84._28_4_ = uVar5;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = puVar1[2];
        auVar54 = vpmovzxbd_avx2(auVar38);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar38 = vfmadd213ps_fma(auVar54,auVar84,auVar82);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = puVar1[3];
        auVar54 = vpmovzxbd_avx2(auVar39);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar39 = vfmadd213ps_fma(auVar54,auVar84,auVar82);
        uVar5 = (undefined4)puVar1[7];
        auVar56._4_4_ = uVar5;
        auVar56._0_4_ = uVar5;
        auVar56._8_4_ = uVar5;
        auVar56._12_4_ = uVar5;
        auVar56._16_4_ = uVar5;
        auVar56._20_4_ = uVar5;
        auVar56._24_4_ = uVar5;
        auVar56._28_4_ = uVar5;
        uVar5 = *(undefined4 *)((long)puVar1 + 0x44);
        auVar85._4_4_ = uVar5;
        auVar85._0_4_ = uVar5;
        auVar85._8_4_ = uVar5;
        auVar85._12_4_ = uVar5;
        auVar85._16_4_ = uVar5;
        auVar85._20_4_ = uVar5;
        auVar85._24_4_ = uVar5;
        auVar85._28_4_ = uVar5;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = puVar1[4];
        auVar54 = vpmovzxbd_avx2(auVar40);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar40 = vfmadd213ps_fma(auVar54,auVar85,auVar56);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = puVar1[5];
        auVar54 = vpmovzxbd_avx2(auVar41);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar41 = vfmadd213ps_fma(auVar54,auVar85,auVar56);
        uVar35 = vcmpps_avx512vl(ZEXT1632(auVar66),auVar25,1);
        auVar57._4_4_ = fVar2 + fVar19;
        auVar57._0_4_ = fVar2 + fVar18;
        auVar57._8_4_ = fVar2 + fVar20;
        auVar57._12_4_ = fVar2 + fVar21;
        auVar57._16_4_ = fVar2 + fVar22;
        auVar57._20_4_ = fVar2 + fVar23;
        auVar57._24_4_ = fVar2 + fVar24;
        auVar57._28_4_ = fVar86;
        uVar28 = vcmpps_avx512vl(ZEXT1632(auVar58),auVar57,6);
        auVar53._4_4_ = fVar72;
        auVar53._0_4_ = fVar65;
        auVar53._8_4_ = fVar73;
        auVar53._12_4_ = fVar74;
        auVar53._16_4_ = fVar75;
        auVar53._20_4_ = fVar76;
        auVar53._24_4_ = fVar77;
        auVar53._28_4_ = fVar78;
        uVar33 = vcmpps_avx512vl(ZEXT1632(auVar38),auVar53,6);
        uVar29 = vcmpps_avx512vl(ZEXT1632(auVar39),auVar59,1);
        uVar30 = vcmpps_avx512vl(ZEXT1632(auVar41),auVar67,1);
        uVar31 = vcmpps_avx512vl(ZEXT1632(auVar40),auVar68,6);
        uVar32 = vcmpps_avx512vl(ZEXT1632(auVar58),ZEXT1632(auVar66),2);
        bVar43 = (byte)uVar34 & (byte)uVar32 &
                 ~((byte)uVar28 | (byte)uVar35 | (byte)uVar33 | (byte)uVar29 | (byte)uVar31 |
                  (byte)uVar30);
      }
      lVar47 = lVar45 * 0x90 + (sVar49 & 0xfffffffffffffff0);
      for (uVar51 = (ulong)bVar43; uVar51 != 0; uVar51 = uVar51 - 1 & uVar51) {
        lVar37 = 0;
        for (uVar27 = uVar51; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        uVar11 = *(uint *)(lVar47 + 0x88);
        uVar12 = *(uint *)(lVar47 + 4 + lVar37 * 8);
        this = (context->scene->geometries).items[uVar11].ptr;
        context->geomID = uVar11;
        context->primID = uVar12;
        bVar50 = Geometry::pointQuery(this,query,context);
        bVar46 = bVar46 | bVar50;
      }
      auVar92 = ZEXT3264(_DAT_01fb4ba0);
      auVar89 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
    }
    if (bVar46 == 0) goto LAB_01c82260;
    uVar5 = *(undefined4 *)&(context->query_radius).field_0;
    auVar59._4_4_ = uVar5;
    auVar59._0_4_ = uVar5;
    auVar59._8_4_ = uVar5;
    auVar59._12_4_ = uVar5;
    auVar59._16_4_ = uVar5;
    auVar59._20_4_ = uVar5;
    auVar59._24_4_ = uVar5;
    auVar59._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar67._4_4_ = uVar5;
    auVar67._0_4_ = uVar5;
    auVar67._8_4_ = uVar5;
    auVar67._12_4_ = uVar5;
    auVar67._16_4_ = uVar5;
    auVar67._20_4_ = uVar5;
    auVar67._24_4_ = uVar5;
    auVar67._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar80._4_4_ = uVar5;
    auVar80._0_4_ = uVar5;
    auVar80._8_4_ = uVar5;
    auVar80._12_4_ = uVar5;
    auVar80._16_4_ = uVar5;
    auVar80._20_4_ = uVar5;
    auVar80._24_4_ = uVar5;
    auVar80._28_4_ = uVar5;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_24e8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      local_24e8 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    }
    bVar44 = true;
  } while( true );
LAB_01c8245b:
  auVar52 = vpshufd_avx2(auVar55,0x55);
  vpermt2q_avx512vl(auVar54,auVar52,auVar26);
  auVar53 = vpminsd_avx2(auVar55,auVar52);
  auVar52 = vpmaxsd_avx2(auVar55,auVar52);
  bVar46 = bVar46 - 1 & bVar46;
  if (bVar46 == 0) {
    auVar53 = vpermi2q_avx512vl(auVar53,auVar54,auVar26);
    sVar49 = auVar53._0_8_;
    auVar54 = vpermt2q_avx512vl(auVar54,auVar52,auVar26);
    (pSVar48->ptr).ptr = auVar54._0_8_;
    lVar45 = 8;
    lStack_2500 = 0x10;
  }
  else {
    auVar81 = vpshufd_avx2(auVar55,0xaa);
    vpermt2q_avx512vl(auVar54,auVar81,auVar26);
    auVar57 = vpminsd_avx2(auVar53,auVar81);
    auVar53 = vpmaxsd_avx2(auVar53,auVar81);
    auVar81 = vpminsd_avx2(auVar52,auVar53);
    auVar53 = vpmaxsd_avx2(auVar52,auVar53);
    bVar46 = bVar46 - 1 & bVar46;
    if (bVar46 == 0) {
      auVar52 = vpermi2q_avx512vl(auVar57,auVar54,auVar26);
      sVar49 = auVar52._0_8_;
      auVar52 = vpermt2q_avx512vl(auVar54,auVar53,auVar26);
      (pSVar48->ptr).ptr = auVar52._0_8_;
      auVar52 = vpermd_avx2(auVar53,auVar60);
      pSVar48->dist = auVar52._0_4_;
      auVar54 = vpermt2q_avx512vl(auVar54,auVar81,auVar26);
      pSVar48[1].ptr.ptr = auVar54._0_8_;
      lVar45 = 0x18;
      lStack_2500 = 0x20;
      auVar52 = auVar81;
    }
    else {
      auVar52 = vpshufd_avx2(auVar55,0xff);
      vpermt2q_avx512vl(auVar54,auVar52,auVar26);
      auVar82 = vpminsd_avx2(auVar57,auVar52);
      auVar57 = vpmaxsd_avx2(auVar57,auVar52);
      auVar52 = vpminsd_avx2(auVar81,auVar57);
      auVar57 = vpmaxsd_avx2(auVar81,auVar57);
      auVar81 = vpminsd_avx2(auVar53,auVar57);
      auVar53 = vpmaxsd_avx2(auVar53,auVar57);
      bVar46 = bVar46 - 1 & bVar46;
      if (bVar46 != 0) {
        auVar56 = valignd_avx512vl(auVar55,auVar55,3);
        auVar55 = vpmovsxbd_avx2(ZEXT816(0x303020108));
        auVar57 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar55,auVar82);
        auVar55 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar52 = vpermt2d_avx512vl(auVar57,auVar55,auVar52);
        auVar55 = vpermt2d_avx512vl(auVar52,auVar55,auVar81);
        auVar52 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar52 = vpermt2d_avx512vl(auVar55,auVar52,auVar53);
        auVar89 = ZEXT3264(auVar52);
        bVar43 = bVar46;
        do {
          auVar53 = auVar89._0_32_;
          auVar52._8_4_ = 1;
          auVar52._0_8_ = 0x100000001;
          auVar52._12_4_ = 1;
          auVar52._16_4_ = 1;
          auVar52._20_4_ = 1;
          auVar52._24_4_ = 1;
          auVar52._28_4_ = 1;
          auVar52 = vpermd_avx2(auVar52,auVar56);
          auVar56 = valignd_avx512vl(auVar56,auVar56,1);
          vpermt2q_avx512vl(auVar54,auVar56,auVar26);
          bVar43 = bVar43 - 1 & bVar43;
          uVar35 = vpcmpd_avx512vl(auVar52,auVar53,5);
          auVar52 = vpmaxsd_avx2(auVar52,auVar53);
          bVar36 = (byte)uVar35 << 1;
          auVar53 = valignd_avx512vl(auVar53,auVar53,7);
          bVar50 = (bool)((byte)uVar35 & 1);
          bVar13 = (bool)(bVar36 >> 2 & 1);
          bVar14 = (bool)(bVar36 >> 3 & 1);
          bVar15 = (bool)(bVar36 >> 4 & 1);
          bVar16 = (bool)(bVar36 >> 5 & 1);
          bVar17 = (bool)(bVar36 >> 6 & 1);
          auVar89 = ZEXT3264(CONCAT428((uint)(bVar36 >> 7) * auVar53._28_4_ |
                                       (uint)!(bool)(bVar36 >> 7) * auVar52._28_4_,
                                       CONCAT424((uint)bVar17 * auVar53._24_4_ |
                                                 (uint)!bVar17 * auVar52._24_4_,
                                                 CONCAT420((uint)bVar16 * auVar53._20_4_ |
                                                           (uint)!bVar16 * auVar52._20_4_,
                                                           CONCAT416((uint)bVar15 * auVar53._16_4_ |
                                                                     (uint)!bVar15 * auVar52._16_4_,
                                                                     CONCAT412((uint)bVar14 *
                                                                               auVar53._12_4_ |
                                                                               (uint)!bVar14 *
                                                                               auVar52._12_4_,
                                                                               CONCAT48((uint)bVar13
                                                                                        * auVar53.
                                                  _8_4_ | (uint)!bVar13 * auVar52._8_4_,
                                                  CONCAT44((uint)bVar50 * auVar53._4_4_ |
                                                           (uint)!bVar50 * auVar52._4_4_,
                                                           auVar52._0_4_))))))));
        } while (bVar43 != 0);
        lVar45 = (ulong)(uint)POPCOUNT((uint)bVar46) + 3;
        while( true ) {
          auVar53 = auVar89._0_32_;
          auVar52 = vpermt2q_avx512vl(auVar54,auVar53,auVar26);
          sVar49 = auVar52._0_8_;
          bVar50 = lVar45 == 0;
          lVar45 = lVar45 + -1;
          if (bVar50) break;
          (pSVar48->ptr).ptr = sVar49;
          auVar52 = vpermd_avx2(auVar53,auVar60);
          pSVar48->dist = auVar52._0_4_;
          auVar52 = valignd_avx512vl(auVar53,auVar53,1);
          auVar89 = ZEXT3264(auVar52);
          pSVar48 = pSVar48 + 1;
        }
        auVar89 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        goto LAB_01c8227d;
      }
      auVar55 = vpermi2q_avx512vl(auVar82,auVar54,auVar26);
      sVar49 = auVar55._0_8_;
      auVar55 = vpermt2q_avx512vl(auVar54,auVar53,auVar26);
      (pSVar48->ptr).ptr = auVar55._0_8_;
      auVar53 = vpermd_avx2(auVar53,auVar60);
      pSVar48->dist = auVar53._0_4_;
      auVar53 = vpermt2q_avx512vl(auVar54,auVar81,auVar26);
      pSVar48[1].ptr.ptr = auVar53._0_8_;
      auVar53 = vpermd_avx2(auVar81,auVar60);
      pSVar48[1].dist = auVar53._0_4_;
      auVar54 = vpermt2q_avx512vl(auVar54,auVar52,auVar26);
      pSVar48[2].ptr.ptr = auVar54._0_8_;
      lStack_2500 = 0x28;
      lVar45 = lStack_2500;
      lStack_2500 = 0x30;
    }
    auVar89 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
  }
  auVar54 = vpermd_avx2(auVar52,auVar60);
  *(int *)((long)&(pSVar48->ptr).ptr + lVar45) = auVar54._0_4_;
  pSVar48 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar48->ptr).ptr + lStack_2500);
  goto LAB_01c8227d;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }